

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O3

void __thiscall
RandomForest::ORForest<double>::Train
          (ORForest<double> *this,double *i_trainData,int i_Ns,int i_Nfp1)

{
  pointer pdVar1;
  pointer psVar2;
  vector<double,_std::allocator<double>_> *__p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> tempSample;
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  tempTrainData;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_48;
  ORForest<double> *local_38;
  
  local_38 = this;
  local_58 = (vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
              *)operator_new(0x18);
  (local_58->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>*>
            (&local_50,local_58);
  std::
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  ::resize(local_58,(long)i_Ns);
  if (0 < i_Ns) {
    uVar5 = 0;
    do {
      __p = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      (__p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (__p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (__p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<double,std::allocator<double>>*>(&local_60,__p);
      std::vector<double,_std::allocator<double>_>::resize(__p,(long)i_Nfp1);
      if (0 < i_Nfp1) {
        pdVar1 = (__p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (long)(__p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
        uVar3 = 0;
        do {
          if (uVar4 == uVar3) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar4);
          }
          pdVar1[uVar3] = i_trainData[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)i_Nfp1 != uVar3);
      }
      psVar2 = (local_58->
               super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_58->
                        super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      psVar2 = psVar2 + uVar5;
      (psVar2->
      super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar2->
                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_60);
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
      }
      uVar5 = uVar5 + 1;
      i_trainData = i_trainData + (uint)i_Nfp1;
    } while (uVar5 != (uint)i_Ns);
  }
  local_48.
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_58;
  local_48.
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  Train(local_38,&local_48);
  if (local_48.
      super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return;
}

Assistant:

void RandomForest::ORForest<T>::Train(const T *i_trainData, int i_Ns, int i_Nfp1)
{
    std::shared_ptr<std::vector<std::shared_ptr<std::vector<T> > > > tempTrainData(new std::vector<std::shared_ptr<std::vector<T> > >);
    tempTrainData->resize(i_Ns);
    for (int i=0; i<i_Ns; i++)
    {
        std::shared_ptr<std::vector<T> > tempSample(new std::vector<T>);
        tempSample->resize(i_Nfp1);
        for (int j=0; j<i_Nfp1; j++)
        {
            tempSample->at(j)=*(i_trainData+i*i_Nfp1+j);
        }
        tempTrainData->at(i)=tempSample;
    }
    Train(tempTrainData);
}